

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atoi.h
# Opt level: O2

type_conflict5 jsteemann::atoi<unsigned_long>(char *p,char *e,bool *valid)

{
  unsigned_long uVar1;
  type_conflict5 tVar2;
  bool bVar3;
  byte bVar4;
  
  if ((p == e) || (*p == '-')) {
    *valid = false;
    return 0;
  }
  if (*p == '+') {
    uVar1 = atoi_positive<unsigned_long>(p + 1,e,valid);
    return uVar1;
  }
  if (p == e) {
    bVar3 = false;
    tVar2 = 0;
  }
  else {
    tVar2 = 0;
    do {
      if ((byte)(*p - 0x3aU) < 0xf6) {
LAB_00129253:
        bVar3 = false;
        goto LAB_00129250;
      }
      bVar4 = *p - 0x30;
      if ((0x1999999999999999 < tVar2) || (tVar2 == 0x1999999999999999 && 5 < bVar4))
      goto LAB_00129253;
      tVar2 = (ulong)bVar4 + tVar2 * 10;
      p = p + 1;
    } while (p < e);
    bVar3 = true;
  }
LAB_00129250:
  *valid = bVar3;
  return tVar2;
}

Assistant:

inline typename std::enable_if<std::is_unsigned<T>::value, T>::type atoi(char const* p, char const* e, bool& valid) noexcept {
  if (ATOI_UNLIKELY(p == e)) {
    valid = false;
    return T();
  }

  if (*p == '-') {
    valid = false;
    return T();
  } 
  if (ATOI_UNLIKELY(*p == '+')) {
    ++p;
  }
  
  return atoi_positive<T>(p, e, valid);
}